

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.h
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChQuaternion<double>::RotateBack(ChQuaternion<double> *this,ChVector<double> *A)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ChVector<double> *in_RDI;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  dVar1 = this->m_data[0];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar1;
  dVar2 = this->m_data[2];
  dVar3 = this->m_data[1];
  dVar4 = this->m_data[3];
  auVar13 = ZEXT816(0x4000000000000000);
  dVar5 = A->m_data[1];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = A->m_data[0];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = A->m_data[2];
  dVar1 = dVar1 * dVar1;
  auVar8._8_8_ = 0x8000000000000000;
  auVar8._0_8_ = 0x8000000000000000;
  auVar8 = vxorpd_avx512vl(auVar9,auVar8);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1 + dVar2 * dVar2;
  auVar9 = vfmadd213sd_avx512f(auVar18,auVar13,ZEXT816(0xbff0000000000000));
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1 + dVar3 * dVar3;
  auVar10 = vfmadd213sd_avx512f(auVar15,auVar13,ZEXT816(0xbff0000000000000));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1 + dVar4 * dVar4;
  auVar11 = vfmadd213sd_avx512f(auVar11,auVar13,ZEXT816(0xbff0000000000000));
  dVar12 = auVar8._0_8_;
  dVar6 = dVar3 * dVar2 - dVar4 * dVar12;
  dVar1 = dVar3 * dVar2 + dVar4 * dVar12;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1 + dVar1;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar5 * auVar9._0_8_;
  auVar8 = vfmadd231sd_fma(auVar19,auVar21,auVar13);
  dVar7 = dVar2 * dVar4 - dVar3 * dVar12;
  dVar1 = dVar3 * dVar12 + dVar2 * dVar4;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar5 * (dVar6 + dVar6);
  auVar9 = vfmadd231sd_fma(auVar20,auVar21,auVar10);
  dVar6 = dVar2 * dVar12 + dVar3 * dVar4;
  dVar2 = dVar3 * dVar4 - dVar2 * dVar12;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar7 + dVar7;
  auVar8 = vfmadd213sd_fma(auVar10,auVar22,auVar8);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar2 + dVar2;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar5 * (dVar1 + dVar1);
  auVar10 = vfmadd231sd_fma(auVar17,auVar21,auVar14);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar6 + dVar6;
  auVar9 = vfmadd213sd_fma(auVar16,auVar22,auVar9);
  auVar10 = vfmadd213sd_fma(auVar11,auVar22,auVar10);
  in_RDI->m_data[0] = auVar9._0_8_;
  in_RDI->m_data[1] = auVar8._0_8_;
  in_RDI->m_data[2] = auVar10._0_8_;
  return in_RDI;
}

Assistant:

inline ChVector<Real> ChQuaternion<Real>::RotateBack(const ChVector<Real>& A) const {
    Real e0e0 = +m_data[0] * m_data[0];
    Real e1e1 = +m_data[1] * m_data[1];
    Real e2e2 = +m_data[2] * m_data[2];
    Real e3e3 = +m_data[3] * m_data[3];
    Real e0e1 = -m_data[0] * m_data[1];
    Real e0e2 = -m_data[0] * m_data[2];
    Real e0e3 = -m_data[0] * m_data[3];
    Real e1e2 = +m_data[1] * m_data[2];
    Real e1e3 = +m_data[1] * m_data[3];
    Real e2e3 = +m_data[2] * m_data[3];
    return ChVector<Real>(((e0e0 + e1e1) * 2 - 1) * A.x() + ((e1e2 - e0e3) * 2) * A.y() + ((e1e3 + e0e2) * 2) * A.z(),
                          ((e1e2 + e0e3) * 2) * A.x() + ((e0e0 + e2e2) * 2 - 1) * A.y() + ((e2e3 - e0e1) * 2) * A.z(),
                          ((e1e3 - e0e2) * 2) * A.x() + ((e2e3 + e0e1) * 2) * A.y() + ((e0e0 + e3e3) * 2 - 1) * A.z());
}